

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxmerge.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  char **argv_local;
  int argc_local;
  
  if (argc < 3) {
    printf("ERROR: not enough arguments provided\n");
    print_help();
  }
  bVar1 = merge_scenes(argv[1],argv + 2,argc - 2);
  if (bVar1) {
    argv_local._4_4_ = 0;
  }
  else {
    argv_local._4_4_ = 99;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char** argv)
{
    if (argc <= 2) {
        printf("ERROR: not enough arguments provided\n");
        print_help();
    }
    // argv[0] = voxmerge.exe
    // argv[1] = output_filename
    // argv[2] = input file 0
    // argv[3] = input file 1
    if (merge_scenes(argv[1], &argv[2], argc-2)) {
        return 0;
    }

    // return an error code
    return 99;
}